

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O3

apx_error_t
apx_clientConnection_tcp_connect(apx_clientSocketConnection_t *self,char *address,uint16_t port)

{
  int8_t iVar1;
  msocket_t *self_00;
  apx_error_t aVar2;
  msocket_handler_t local_58;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    aVar2 = 1;
  }
  else {
    aVar2 = 2;
    self_00 = msocket_new('\x02');
    if (self_00 != (msocket_t *)0x0) {
      local_58.tcp_inactivity = (_func_void_uint32_t *)0x0;
      local_58.tcp_accept = (_func_void_void_ptr_msocket_server_tag_ptr_msocket_t_ptr *)0x0;
      local_58.udp_msg = (_func_void_void_ptr_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0;
      local_58.tcp_connected = on_socket_connected;
      local_58.tcp_data = on_socket_data;
      local_58.tcp_disconnected = on_socket_disconnected;
      msocket_set_handler(self_00,&local_58,self);
      self->socket_object = self_00;
      iVar1 = msocket_connect(self_00,address,port);
      if (iVar1 == '\0') {
        aVar2 = 0;
      }
      else {
        msocket_delete(self_00);
        self->socket_object = (msocket_t *)0x0;
        aVar2 = 0x22;
      }
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_clientConnection_tcp_connect(apx_clientSocketConnection_t *self, const char *address, uint16_t port)
{
   if (self != 0)
   {
      apx_error_t retval = APX_NO_ERROR;
      msocket_t *socketObject = msocket_new(AF_INET);
      if (socketObject != 0)
      {
         int8_t result = 0;
         register_msocket_handler(self, socketObject);
         result = msocket_connect(socketObject, address, port);
         if (result != 0)
         {
            msocket_delete(socketObject);
            self->socket_object = (SOCKET_TYPE*) 0;
            retval = APX_CONNECTION_ERROR;
         }
         else
         {

         }
      }
      else
      {
         retval = APX_MEM_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}